

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManResubAddNode(Gia_ResbMan_t *p,int iLit0,int iLit1,int Type)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  uint c;
  
  iVar4 = iLit1;
  iVar3 = iLit0;
  if (iLit1 < iLit0 != (Type == 2)) {
    iVar4 = iLit0;
    iVar3 = iLit1;
  }
  if (iLit0 == iLit1) {
    __assert_fail("iLit0 != iLit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x459,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
  }
  p_00 = p->vGates;
  iVar1 = p->vDivs->nSize;
  iVar2 = p_00->nSize;
  if (Type == 2) {
    if (iVar3 <= iVar4) {
      __assert_fail("iFan0 > iFan1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x45b,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
    }
  }
  else if (iVar4 <= iVar3) {
    __assert_fail("iFan0 < iFan1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x45d,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
  }
  c = (uint)(Type == 1);
  iVar3 = Abc_LitNotCond(iVar3,c);
  iVar4 = Abc_LitNotCond(iVar4,c);
  Vec_IntPushTwo(p_00,iVar3,iVar4);
  iVar3 = Abc_Var2Lit(iVar1 + iVar2 / 2,c);
  return iVar3;
}

Assistant:

int Gia_ManResubAddNode( Gia_ResbMan_t * p, int iLit0, int iLit1, int Type )
{
    int iNode = Vec_PtrSize(p->vDivs) + Vec_IntSize(p->vGates)/2;
    int fFlip = (Type == 2) ^ (iLit0 > iLit1);
    int iFan0 = fFlip ? iLit1 : iLit0;
    int iFan1 = fFlip ? iLit0 : iLit1;
    assert( iLit0 != iLit1 );
    if ( Type == 2 )
        assert( iFan0 > iFan1 );
    else
        assert( iFan0 < iFan1 );
    Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iFan0, Type==1), Abc_LitNotCond(iFan1, Type==1) );
    return Abc_Var2Lit( iNode, Type==1 );
}